

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

bool CompileTypemask(SQIntVec *res,SQChar *typemask)

{
  sqvector<long_long> *this;
  long in_RSI;
  SQInteger mask;
  SQInteger i;
  longlong *in_stack_ffffffffffffffc8;
  long local_20;
  
  local_20 = 0;
LAB_0012b050:
  do {
    if (*(char *)(in_RSI + local_20) == '\0') {
      return true;
    }
    this = (sqvector<long_long> *)(ulong)((int)*(char *)(in_RSI + local_20) - 0x20);
    switch(this) {
    case (sqvector<long_long> *)0x0:
      local_20 = local_20 + 1;
      goto LAB_0012b050;
    default:
      return false;
    case (sqvector<long_long> *)0xe:
      sqvector<long_long>::push_back(this,in_stack_ffffffffffffffc8);
      local_20 = local_20 + 1;
      goto LAB_0012b050;
    case (sqvector<long_long> *)0x41:
      break;
    case (sqvector<long_long> *)0x42:
      break;
    case (sqvector<long_long> *)0x43:
      break;
    case (sqvector<long_long> *)0x46:
      break;
    case (sqvector<long_long> *)0x47:
      break;
    case (sqvector<long_long> *)0x49:
      break;
    case (sqvector<long_long> *)0x4e:
      break;
    case (sqvector<long_long> *)0x4f:
      break;
    case (sqvector<long_long> *)0x50:
      break;
    case (sqvector<long_long> *)0x52:
      break;
    case (sqvector<long_long> *)0x53:
      break;
    case (sqvector<long_long> *)0x54:
      break;
    case (sqvector<long_long> *)0x55:
      break;
    case (sqvector<long_long> *)0x56:
      break;
    case (sqvector<long_long> *)0x58:
      break;
    case (sqvector<long_long> *)0x59:
    }
    if (*(char *)(in_RSI + local_20 + 1) == '|') {
      local_20 = local_20 + 2;
      if (*(char *)(in_RSI + local_20) == '\0') {
        return false;
      }
    }
    else {
      sqvector<long_long>::push_back(this,in_stack_ffffffffffffffc8);
      local_20 = local_20 + 1;
    }
  } while( true );
}

Assistant:

bool CompileTypemask(SQIntVec &res,const SQChar *typemask)
{
    SQInteger i = 0;
    SQInteger mask = 0;
    while(typemask[i] != 0) {
        switch(typemask[i]) {
            case 'o': mask |= _RT_NULL; break;
            case 'i': mask |= _RT_INTEGER; break;
            case 'f': mask |= _RT_FLOAT; break;
            case 'n': mask |= (_RT_FLOAT | _RT_INTEGER); break;
            case 's': mask |= _RT_STRING; break;
            case 't': mask |= _RT_TABLE; break;
            case 'a': mask |= _RT_ARRAY; break;
            case 'u': mask |= _RT_USERDATA; break;
            case 'c': mask |= (_RT_CLOSURE | _RT_NATIVECLOSURE); break;
            case 'b': mask |= _RT_BOOL; break;
            case 'g': mask |= _RT_GENERATOR; break;
            case 'p': mask |= _RT_USERPOINTER; break;
            case 'v': mask |= _RT_THREAD; break;
            case 'x': mask |= _RT_INSTANCE; break;
            case 'y': mask |= _RT_CLASS; break;
            case 'r': mask |= _RT_WEAKREF; break;
            case '.': mask = -1; res.push_back(mask); i++; mask = 0; continue;
            case ' ': i++; continue; //ignores spaces
            default:
                return false;
        }
        i++;
        if(typemask[i] == '|') {
            i++;
            if(typemask[i] == 0)
                return false;
            continue;
        }
        res.push_back(mask);
        mask = 0;

    }
    return true;
}